

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O3

string * __thiscall
phosg::StringReader::all_abi_cxx11_(string *__return_storage_ptr__,StringReader *this)

{
  uint8_t *puVar1;
  size_t sVar2;
  
  puVar1 = this->data;
  sVar2 = this->length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,puVar1,puVar1 + sVar2);
  return __return_storage_ptr__;
}

Assistant:

string StringReader::all() const {
  return string(reinterpret_cast<const char*>(this->data), this->length);
}